

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaParseNewDocWithContext
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  byte *pbVar1;
  uint uVar2;
  xmlSchemaConstructionCtxtPtr pxVar3;
  xmlSchemaBucketPtr_conflict pxVar4;
  long lVar5;
  xmlChar *pxVar6;
  int iVar7;
  uint uVar8;
  xmlNodePtr pxVar9;
  undefined4 extraout_var;
  xmlAttrPtr pxVar10;
  xmlSchemaTypePtr pxVar11;
  xmlNodePtr pxVar12;
  xmlSchemaAnnotPtr *ppxVar13;
  xmlSchemaAnnotPtr pxVar14;
  xmlSchemaTypePtr pxVar15;
  xmlChar *pxVar16;
  xmlSchemaTypePtr pxVar17;
  undefined8 *item;
  xmlSchemaTypePtr pxVar18;
  xmlSchemaAttributePtr_conflict pxVar19;
  xmlChar *name;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar20;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlChar *name_01;
  xmlParserErrors error;
  char *in_R8;
  char *in_R9;
  int *piVar21;
  xmlSchemaTypePtr pxStackY_a0;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  xmlChar *in_stack_ffffffffffffff78;
  _xmlSchemaType **in_stack_ffffffffffffff80;
  xmlSchemaTypePtr local_70;
  xmlChar *namespaceName;
  int local_54;
  xmlSchemaTypePtr local_50;
  xmlChar *schemaLocation;
  _xmlSchemaType *local_40;
  xmlDocPtr local_38;
  
  pxVar3 = pctxt->constructor;
  pxVar4 = pxVar3->bucket;
  piVar21 = &schema->flags;
  uVar2 = schema->flags;
  if ((uVar2 & 0x1ff) != 0) {
    *piVar21 = uVar2 & 0xfffffe00;
  }
  local_38 = schema->doc;
  schema->doc = bucket->doc;
  pctxt->schema = schema;
  pxVar16 = bucket->targetNamespace;
  pctxt->targetNamespace = pxVar16;
  pxVar3->bucket = bucket;
  if ((pxVar16 != (xmlChar *)0x0) &&
     (iVar7 = xmlStrEqual(pxVar16,(xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)) {
    pctxt->isS4S = 1;
  }
  bucket->parsed = bucket->parsed + 1;
  pxVar9 = xmlDocGetRootElement(bucket->doc);
  local_54 = pctxt->nberrors;
  iVar7 = xmlSchemaPValAttrID(pctxt,pxVar9,name);
  pxStackY_a0 = (xmlSchemaTypePtr)CONCAT44(extraout_var,iVar7);
  local_70 = (xmlSchemaTypePtr)0xffffffffffffffff;
  if (iVar7 == -1) goto LAB_001867d5;
  pxVar10 = xmlSchemaGetPropNode(pxVar9,"targetNamespace");
  if (pxVar10 == (xmlAttrPtr)0x0) {
LAB_001858c1:
    pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar9,"elementFormDefault");
    if (pxVar12 != (xmlNodePtr)0x0) {
      ppxVar13 = (xmlSchemaAnnotPtr *)xmlSchemaGetNodeContent(pctxt,pxVar12);
      pxStackY_a0 = (xmlSchemaTypePtr)0x1;
      iVar7 = xmlSchemaPValAttrFormDefault((xmlChar *)ppxVar13,piVar21,1);
      if (iVar7 == 0) {
        pxStackY_a0 = (xmlSchemaTypePtr)0x0;
      }
      else {
        in_stack_ffffffffffffff68 = (char *)0x0;
        in_stack_ffffffffffffff70 = 0;
        in_R8 = "(qualified | unqualified)";
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_ELEMFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)ppxVar13,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff78,
                   (xmlChar *)in_stack_ffffffffffffff80);
        in_R9 = (char *)ppxVar13;
      }
    }
    pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar9,"attributeFormDefault");
    if (pxVar12 != (xmlNodePtr)0x0) {
      ppxVar13 = (xmlSchemaAnnotPtr *)xmlSchemaGetNodeContent(pctxt,pxVar12);
      iVar7 = xmlSchemaPValAttrFormDefault((xmlChar *)ppxVar13,piVar21,2);
      if (iVar7 == 0) {
        pxStackY_a0 = (xmlSchemaTypePtr)0x0;
      }
      else {
        pxStackY_a0 = (xmlSchemaTypePtr)0x1;
        in_stack_ffffffffffffff68 = (char *)0x0;
        in_stack_ffffffffffffff70 = 0;
        in_R8 = "(qualified | unqualified)";
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_ATTRFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)ppxVar13,
                   (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff78,
                   (xmlChar *)in_stack_ffffffffffffff80);
        in_R9 = (char *)ppxVar13;
      }
    }
    pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar9,"finalDefault");
    if (pxVar12 != (xmlNodePtr)0x0) {
      ppxVar13 = (xmlSchemaAnnotPtr *)xmlSchemaGetNodeContent(pctxt,pxVar12);
      in_stack_ffffffffffffff68 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0x20);
      in_R8 = (char *)0xffffffffffffffff;
      in_R9 = (char *)0x10;
      uVar8 = xmlSchemaPValAttrBlockFinal
                        ((xmlChar *)ppxVar13,piVar21,4,8,-1,0x10,0x20,in_stack_ffffffffffffff70);
      local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
      if (uVar8 == 0xffffffff) goto LAB_001867d5;
      pxStackY_a0 = local_70;
      if (uVar8 != 0) {
        in_stack_ffffffffffffff68 = (char *)0x0;
        in_stack_ffffffffffffff70 = 0;
        in_R8 = "(#all | List of (extension | restriction | list | union))";
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                   (xmlNodePtr)0x0,
                   (xmlSchemaTypePtr)"(#all | List of (extension | restriction | list | union))",
                   (char *)ppxVar13,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff78,
                   (xmlChar *)in_stack_ffffffffffffff80);
        pxStackY_a0 = (xmlSchemaTypePtr)0x1;
        in_R9 = (char *)ppxVar13;
      }
    }
    pxVar12 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar9,"blockDefault");
    if (pxVar12 != (xmlNodePtr)0x0) {
      ppxVar13 = (xmlSchemaAnnotPtr *)xmlSchemaGetNodeContent(pctxt,pxVar12);
      in_stack_ffffffffffffff68 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
      in_R9 = (char *)0xffffffffffffffff;
      in_R8 = (char *)0x100;
      uVar8 = xmlSchemaPValAttrBlockFinal
                        ((xmlChar *)ppxVar13,piVar21,0x40,0x80,0x100,-1,-1,in_stack_ffffffffffffff70
                        );
      local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
      if (uVar8 == 0xffffffff) goto LAB_001867d5;
      pxStackY_a0 = local_70;
      if (uVar8 != 0) {
        in_stack_ffffffffffffff68 = (char *)0x0;
        in_R8 = "(#all | List of (extension | restriction | substitution))";
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar12,
                   (xmlNodePtr)0x0,
                   (xmlSchemaTypePtr)"(#all | List of (extension | restriction | substitution))",
                   (char *)ppxVar13,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff78,
                   (xmlChar *)in_stack_ffffffffffffff80);
        pxStackY_a0 = (xmlSchemaTypePtr)0x1;
        in_R9 = (char *)ppxVar13;
      }
    }
  }
  else {
    pxVar11 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    uVar8 = xmlSchemaPValAttrNode
                      (pctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)pxVar11,
                       (xmlSchemaTypePtr)0x0,(xmlChar **)in_R8);
    local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
    if (uVar8 == 0xffffffff) goto LAB_001867d5;
    pxStackY_a0 = local_70;
    if (uVar8 == 0) goto LAB_001858c1;
    pctxt->stop = 0xbdd;
  }
  if (local_54 != pctxt->nberrors) {
    pxStackY_a0 = (xmlSchemaTypePtr)(ulong)(uint)pctxt->err;
  }
  local_70 = pxStackY_a0;
  if ((int)pxStackY_a0 == 0) {
    pxVar11 = (xmlSchemaTypePtr)pxVar9->children;
    if (pxVar11 == (xmlSchemaTypePtr)0x0) {
      local_70 = (xmlSchemaTypePtr)0x0;
    }
    else {
      local_70 = (xmlSchemaTypePtr)0x0;
      local_54 = pctxt->nberrors;
      while (((pxVar11 != (xmlSchemaTypePtr)0x0 && (pxVar11->node != (xmlNodePtr)0x0)) &&
             (((iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"include"), iVar7 != 0 &&
               (iVar7 = xmlStrEqual(pxVar11->node->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)) ||
              ((pxVar11->node != (xmlNodePtr)0x0 &&
               (((iVar7 = xmlStrEqual(pxVar11->name,"import"), iVar7 != 0 &&
                 (iVar7 = xmlStrEqual(pxVar11->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0))
                || ((pxVar11->node != (xmlNodePtr)0x0 &&
                    (((iVar7 = xmlStrEqual(pxVar11->name,"redefine"), iVar7 != 0 &&
                      (iVar7 = xmlStrEqual(pxVar11->node->name,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar7 != 0)) ||
                     ((pxVar11->node != (xmlNodePtr)0x0 &&
                      ((iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"annotation"), iVar7 != 0 &&
                       (iVar7 = xmlStrEqual(pxVar11->node->name,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar7 != 0))))))))))))))))) {
        if (pxVar11->node != (xmlNodePtr)0x0) {
          iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"annotation");
          if ((iVar7 == 0) ||
             (iVar7 = xmlStrEqual(pxVar11->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar7 == 0)) {
            if (pxVar11->node != (xmlNodePtr)0x0) {
              iVar7 = xmlStrEqual(pxVar11->name,"import");
              if ((iVar7 == 0) ||
                 (iVar7 = xmlStrEqual(pxVar11->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
                if (pxVar11->node != (xmlNodePtr)0x0) {
                  iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"include");
                  if ((iVar7 == 0) ||
                     (iVar7 = xmlStrEqual(pxVar11->node->name,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0
                     )) {
                    if ((pxVar11->node == (xmlNodePtr)0x0) ||
                       ((iVar7 = xmlStrEqual(pxVar11->name,"redefine"), iVar7 == 0 ||
                        (iVar7 = xmlStrEqual(pxVar11->node->name,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar7 == 0)))) goto LAB_00185ea0;
                    iVar7 = pctxt->nberrors;
                    pxStackY_a0 = (xmlSchemaTypePtr)0x3;
                  }
                  else {
                    iVar7 = pctxt->nberrors;
                    pxStackY_a0 = (xmlSchemaTypePtr)0x2;
                  }
                  uVar8 = xmlSchemaParseIncludeOrRedefine
                                    (pctxt,schema,(xmlNodePtr)pxVar11,(int)pxStackY_a0);
                  local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
                  if (uVar8 == 0xffffffff) {
                    local_70 = (xmlSchemaTypePtr)0xffffffff;
                    goto LAB_001867d5;
                  }
                  if ((pctxt->stop != 0) || (iVar7 != pctxt->nberrors)) goto LAB_0018678f;
                }
              }
              else {
                local_50 = (xmlSchemaTypePtr)CONCAT44(local_50._4_4_,pctxt->nberrors);
                namespaceName = (xmlChar *)0x0;
                schemaLocation = (xmlChar *)0x0;
                local_40 = (_xmlSchemaType *)0x0;
                piVar21 = &pxVar11->flags;
                while (lVar5 = *(long *)piVar21, lVar5 != 0) {
                  if (*(long *)(lVar5 + 0x48) == 0) {
                    iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"id");
                    if (((iVar7 == 0) &&
                        (iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"namespace"), iVar7 == 0))
                       && (iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"schemaLocation"),
                          pxVar20 = extraout_RDX_00, iVar7 == 0)) goto LAB_00185c93;
                  }
                  else {
                    iVar7 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar5 + 0x48) + 0x10),
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                    pxVar20 = extraout_RDX;
                    if (iVar7 != 0) {
LAB_00185c93:
                      xmlSchemaPIllegalAttrErr
                                (pctxt,(xmlParserErrors)lVar5,pxVar20,(xmlAttrPtr)pxStackY_a0);
                    }
                  }
                  piVar21 = (int *)(lVar5 + 0x30);
                }
                pxVar15 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar11,(xmlNodePtr)0x1d30c1,
                                          (char *)pxVar15,(xmlSchemaTypePtr)&namespaceName,
                                          (xmlChar **)in_R9);
                pxStackY_a0 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                if (iVar7 == 0) {
                  iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar11,
                                            (xmlNodePtr)0x1d31c4,(char *)pxStackY_a0,
                                            (xmlSchemaTypePtr)&schemaLocation,(xmlChar **)in_R9);
                  if (iVar7 != 0) {
                    pxStackY_a0 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                    in_stack_ffffffffffffff68 = (char *)0x0;
                    in_R8 = (char *)0x0;
                    in_R9 = (char *)schemaLocation;
                    xmlSchemaPSimpleTypeErr
                              (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                               (xmlSchemaBasicItemPtr)pxVar11,(xmlNodePtr)pxStackY_a0,
                               (xmlSchemaTypePtr)0x0,(char *)schemaLocation,(xmlChar *)0x0,
                               (char *)0x0,in_stack_ffffffffffffff78,
                               (xmlChar *)in_stack_ffffffffffffff80);
                    uVar8 = pctxt->err;
                    goto LAB_00185e6c;
                  }
                  pxVar9 = (xmlNodePtr)pxVar11->id;
                  if ((pxVar9 != (xmlNodePtr)0x0) &&
                     (((pxVar9->ns == (xmlNs *)0x0 ||
                       (iVar7 = xmlStrEqual(pxVar9->name,(xmlChar *)"annotation"), iVar7 == 0)) ||
                      ((iVar7 = xmlStrEqual(pxVar9->ns->href,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar7 == 0 || (pxVar9 = pxVar9->next, pxVar9 != (_xmlNode *)0x0)))))) {
                    xmlSchemaPContentErr
                              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar11
                               ,pxVar9,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff68);
                  }
                  ppxVar13 = (xmlSchemaAnnotPtr *)pctxt->constructor->bucket->origTargetNamespace;
                  if (namespaceName != (xmlChar *)0x0) {
                    iVar7 = xmlStrEqual((xmlChar *)ppxVar13,namespaceName);
                    if (iVar7 == 0) goto LAB_00185f59;
                    error = XML_SCHEMAP_SRC_IMPORT_1_1;
                    in_R8 = 
                    "The value of the attribute \'namespace\' must not match the target namespace \'%s\' of the importing schema"
                    ;
                    in_R9 = (char *)ppxVar13;
LAB_00186033:
                    pxStackY_a0 = pxVar11;
                    xmlSchemaPCustomErr(pctxt,error,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)pxVar11,
                                        in_R8,(xmlChar *)in_R9);
                    local_70 = (xmlSchemaTypePtr)(ulong)(uint)pctxt->err;
                    goto LAB_00185e73;
                  }
                  if (ppxVar13 == (xmlSchemaAnnotPtr *)0x0) {
                    error = XML_SCHEMAP_SRC_IMPORT_1_2;
                    in_R8 = 
                    "The attribute \'namespace\' must be existent if the importing schema has no target namespace"
                    ;
                    in_R9 = (char *)0x0;
                    goto LAB_00186033;
                  }
LAB_00185f59:
                  if (schemaLocation == (xmlChar *)0x0) {
                    pxVar16 = (xmlChar *)0x0;
                  }
                  else {
                    pxVar16 = xmlSchemaBuildAbsoluteURI
                                        (pctxt->dict,schemaLocation,(xmlNodePtr)pxVar11);
                    schemaLocation = pxVar16;
                  }
                  in_stack_ffffffffffffff80 = &local_40;
                  pxStackY_a0 = (xmlSchemaTypePtr)0x0;
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)0x0;
                  in_stack_ffffffffffffff68 = (char *)pxVar11;
                  in_stack_ffffffffffffff78 = namespaceName;
                  uVar8 = xmlSchemaAddSchemaDoc
                                    (pctxt,1,pxVar16,(xmlDocPtr)0x0,(char *)0x0,0,
                                     (xmlNodePtr)pxVar11,(xmlChar *)ppxVar13,namespaceName,
                                     (xmlSchemaBucketPtr_conflict *)in_stack_ffffffffffffff80);
                  local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
                  if (uVar8 != 0) goto LAB_00185e73;
                  pxStackY_a0 = (xmlSchemaTypePtr)
                                CONCAT71((int7)((ulong)pxStackY_a0 >> 8),
                                         schemaLocation != (xmlChar *)0x0 &&
                                         local_40 == (_xmlSchemaType *)0x0);
                  in_R8 = (char *)schemaLocation;
                  if (schemaLocation != (xmlChar *)0x0 && local_40 == (_xmlSchemaType *)0x0) {
                    in_stack_ffffffffffffff68 = (char *)0x0;
                    pxStackY_a0 = (xmlSchemaTypePtr)0x1d2f3b;
                    in_R9 = (char *)0x0;
                    xmlSchemaCustomWarning
                              ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_UNLOCATED_SCHEMA,
                               (xmlNodePtr)pxVar11,
                               (xmlSchemaTypePtr)
                               "Failed to locate a schema at location \'%s\'. Skipping the import",
                               (char *)schemaLocation,(xmlChar *)0x0,(xmlChar *)0x0,
                               (xmlChar *)ppxVar13);
                  }
                  if (((local_40 != (_xmlSchemaType *)0x0) &&
                      ((xmlDocPtr)local_40->ref != (xmlDocPtr)0x0)) &&
                     (*(int *)((long)&local_40->annot + 4) == 0)) {
                    uVar8 = xmlSchemaParseNewDoc(pctxt,schema,(xmlSchemaBucketPtr_conflict)local_40)
                    ;
                    local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
                    goto LAB_00185e73;
                  }
                  local_70 = (xmlSchemaTypePtr)0x0;
                }
                else {
                  in_stack_ffffffffffffff68 = (char *)0x0;
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)namespaceName;
                  xmlSchemaPSimpleTypeErr
                            (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11
                             ,(xmlNodePtr)pxStackY_a0,(xmlSchemaTypePtr)0x0,(char *)namespaceName,
                             (xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff78,
                             (xmlChar *)in_stack_ffffffffffffff80);
                  uVar8 = pctxt->err;
LAB_00185e6c:
                  local_70 = (xmlSchemaTypePtr)(ulong)uVar8;
LAB_00185e73:
                  if ((int)local_70 == -1) {
                    local_70 = (xmlSchemaTypePtr)0xffffffff;
                    goto LAB_001867d5;
                  }
                }
                if ((pctxt->stop != 0) || ((int)local_50 != pctxt->nberrors)) goto LAB_0018678f;
              }
            }
          }
          else {
            pxVar14 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar11,1);
            if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
              schema->annot = pxVar14;
            }
            else {
              xmlSchemaFreeAnnot(pxVar14);
            }
          }
        }
LAB_00185ea0:
        pxVar11 = (xmlSchemaTypePtr)pxVar11->annot;
      }
      while (pxVar11 != (xmlSchemaTypePtr)0x0) {
        if (pxVar11->node == (xmlNodePtr)0x0) {
LAB_001863ed:
          pxVar15 = (xmlSchemaTypePtr)pxVar11->refNs;
          in_R9 = 
          "((include | import | redefine | annotation)*, (((simpleType | complexType | group | attributeGroup) | element | attribute | notation), annotation*)*)"
          ;
          pxStackY_a0 = pxVar11;
LAB_00186403:
          in_R8 = (char *)0x0;
          xmlSchemaPContentErr
                    (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar15,
                     (xmlNodePtr)pxStackY_a0,(xmlNodePtr)0x0,in_R9,in_stack_ffffffffffffff68);
        }
        else {
          iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"complexType");
          if ((iVar7 != 0) &&
             (iVar7 = xmlStrEqual(pxVar11->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar7 != 0)) {
            pxStackY_a0 = (xmlSchemaTypePtr)0x1;
            xmlSchemaParseComplexType(pctxt,schema,(xmlNodePtr)pxVar11,1);
            goto LAB_0018640b;
          }
          if (pxVar11->node == (xmlNodePtr)0x0) goto LAB_001863ed;
          iVar7 = xmlStrEqual(pxVar11->name,"simpleType");
          if ((iVar7 != 0) &&
             (iVar7 = xmlStrEqual(pxVar11->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar7 != 0)) {
            pxStackY_a0 = (xmlSchemaTypePtr)0x1;
            xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)pxVar11,1);
            goto LAB_0018640b;
          }
          if (pxVar11->node == (xmlNodePtr)0x0) goto LAB_001863ed;
          iVar7 = xmlStrEqual(pxVar11->name,"element");
          if ((iVar7 != 0) &&
             (iVar7 = xmlStrEqual(pxVar11->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar7 != 0)) {
            in_R8 = (char *)0x1;
            pxStackY_a0 = (xmlSchemaTypePtr)0x0;
            xmlSchemaParseElement(pctxt,schema,(xmlNodePtr)pxVar11,(int *)0x0,1);
            goto LAB_0018640b;
          }
          if (pxVar11->node == (xmlNodePtr)0x0) goto LAB_001863ed;
          iVar7 = xmlStrEqual(pxVar11->name,"attribute");
          pxVar15 = pxVar11;
          if ((iVar7 == 0) ||
             (iVar7 = xmlStrEqual(pxVar11->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar7 == 0)) {
            if (pxVar11->node == (xmlNodePtr)0x0) goto LAB_001863ed;
            iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"attributeGroup");
            if ((iVar7 == 0) ||
               (iVar7 = xmlStrEqual(pxVar11->node->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
              if (pxVar11->node == (xmlNodePtr)0x0) goto LAB_001863ed;
              iVar7 = xmlStrEqual(pxVar11->name,"group");
              if ((iVar7 == 0) ||
                 (iVar7 = xmlStrEqual(pxVar11->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0)) {
                if (((pxVar11->node == (xmlNodePtr)0x0) ||
                    (iVar7 = xmlStrEqual(pxVar11->name,"notation"), iVar7 == 0)) ||
                   (iVar7 = xmlStrEqual(pxVar11->node->name,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 == 0))
                goto LAB_001863ed;
                pxVar16 = xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar11,"name");
                if (pxVar16 == (xmlChar *)0x0) {
                  pxStackY_a0 = (xmlSchemaTypePtr)0x1d443b;
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)0x0;
                  xmlSchemaPErr(pctxt,(xmlNodePtr)pxVar11,0x6bb,"Notation has no name\n",
                                (xmlChar *)0x0,(xmlChar *)0x0);
                }
                else {
                  pxVar6 = pctxt->targetNamespace;
                  item = (undefined8 *)(*xmlMalloc)(0x28);
                  if (item == (undefined8 *)0x0) {
                    xmlSchemaPErrMemory(pctxt);
                  }
                  else {
                    *item = 0;
                    item[1] = 0;
                    item[2] = 0;
                    item[3] = 0;
                    *(undefined4 *)item = 0x12;
                    item[1] = pxVar16;
                    item[4] = pxVar6;
                    iVar7 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->globals,5,item);
                    if (iVar7 < 0) {
                      xmlSchemaPErrMemory(pctxt);
                      (*xmlFree)(item);
                    }
                    else {
                      xmlSchemaPValAttrID(pctxt,(xmlNodePtr)pxVar11,name_00);
                      pxVar17 = (xmlSchemaTypePtr)pxVar11->id;
                      if (pxVar17 != (xmlSchemaTypePtr)0x0) {
                        if (((pxVar17->node != (xmlNodePtr)0x0) &&
                            (iVar7 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar7 != 0)
                            ) && (iVar7 = xmlStrEqual(pxVar17->node->name,
                                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema")
                                 , iVar7 != 0)) {
                          pxVar14 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar17,1);
                          item[2] = pxVar14;
                          pxVar17 = (xmlSchemaTypePtr)pxVar17->annot;
                          if (pxVar17 == (xmlSchemaTypePtr)0x0) goto LAB_0018640b;
                        }
                        in_R9 = "(annotation?)";
                        pxStackY_a0 = pxVar17;
                        goto LAB_00186403;
                      }
                    }
                  }
                }
              }
              else {
                xmlSchemaParseModelGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar11);
              }
            }
            else {
              xmlSchemaParseAttributeGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar11);
            }
          }
          else {
            pxVar10 = xmlSchemaGetPropNode((xmlNodePtr)pxVar11,"name");
            if (pxVar10 == (xmlAttrPtr)0x0) {
              xmlSchemaPMissingAttrErr
                        (pctxt,(xmlParserErrors)pxVar11,(xmlSchemaBasicItemPtr)0x1bc044,
                         (xmlNodePtr)pxStackY_a0,in_R8,in_R9);
            }
            else {
              pxVar17 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
              pxStackY_a0 = (xmlSchemaTypePtr)&namespaceName;
              iVar7 = xmlSchemaPValAttrNode
                                (pctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlAttrPtr)pxVar17,
                                 pxStackY_a0,(xmlChar **)in_R8);
              if (iVar7 == 0) {
                iVar7 = xmlStrEqual(namespaceName,"xmlns");
                if (iVar7 == 0) {
                  iVar7 = xmlStrEqual(pctxt->targetNamespace,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
                  if (iVar7 != 0) {
                    in_stack_ffffffffffffff68 = (char *)0x0;
                    in_R9 = "http://www.w3.org/2001/XMLSchema-instance";
                    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_NO_XSI,
                                       (xmlNodePtr)pxVar11,(xmlSchemaBasicItemPtr)0x0,
                                       "The target namespace must not match \'%s\'",
                                       (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",
                                       (xmlChar *)0x0);
                  }
                  in_R8 = (char *)0x1;
                  pxStackY_a0 = pxVar11;
                  pxVar17 = (xmlSchemaTypePtr)
                            xmlSchemaAddAttribute
                                      (pctxt,(xmlSchemaPtr)namespaceName,pctxt->targetNamespace,
                                       (xmlChar *)pxVar11,(xmlNodePtr)0x1,(int)in_R9);
                  if (pxVar17 != (xmlSchemaTypePtr)0x0) {
                    *(byte *)&pxVar17->facets = *(byte *)&pxVar17->facets | 1;
                    piVar21 = &pxVar11->flags;
                    local_50 = pxVar17;
                    while (lVar5 = *(long *)piVar21, lVar5 != 0) {
                      if (*(long *)(lVar5 + 0x48) == 0) {
                        iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"id");
                        if ((((iVar7 == 0) &&
                             (iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"default"), iVar7 == 0
                             )) && (iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),
                                                        (xmlChar *)"fixed"), iVar7 == 0)) &&
                           ((iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"name"), iVar7 == 0 &&
                            (iVar7 = xmlStrEqual(*(xmlChar **)(lVar5 + 0x10),"type"),
                            pxVar20 = extraout_RDX_02, iVar7 == 0)))) goto LAB_00186516;
                      }
                      else {
                        iVar7 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar5 + 0x48) + 0x10),
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                        pxVar20 = extraout_RDX_01;
                        if (iVar7 != 0) {
LAB_00186516:
                          xmlSchemaPIllegalAttrErr
                                    (pctxt,(xmlParserErrors)lVar5,pxVar20,(xmlAttrPtr)pxStackY_a0);
                        }
                      }
                      piVar21 = (int *)(lVar5 + 0x30);
                    }
                    in_R8 = (char *)&pxVar17->subtypes;
                    ppxVar13 = &pxVar17->annot;
                    pxStackY_a0 = (xmlSchemaTypePtr)0x1d3e80;
                    in_R9 = (char *)ppxVar13;
                    xmlSchemaPValAttrQName
                              (pctxt,schema,(xmlSchemaBasicItemPtr)pxVar11,(xmlNodePtr)0x1d3e80,
                               in_R8,(xmlChar **)ppxVar13,(xmlChar **)in_stack_ffffffffffffff68);
                    xmlSchemaPValAttrID(pctxt,(xmlNodePtr)pxVar11,name_01);
                    pxVar16 = xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar11,"fixed");
                    pxVar17 = local_50;
                    *(xmlChar **)&local_50->flags = pxVar16;
                    if (pxVar16 != (xmlChar *)0x0) {
                      pbVar1 = (byte *)((long)&local_50->facets + 1);
                      *pbVar1 = *pbVar1 | 2;
                    }
                    pxVar18 = (xmlSchemaTypePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar11,"default");
                    if (pxVar18 != (xmlSchemaTypePtr)0x0) {
                      if (((ulong)pxVar17->facets & 0x200) == 0) {
                        pxVar16 = xmlSchemaGetNodeContent(pctxt,(xmlNodePtr)pxVar18);
                        *(xmlChar **)&pxVar17->flags = pxVar16;
                      }
                      else {
                        in_R8 = "default";
                        in_R9 = "fixed";
                        xmlSchemaPMutualExclAttrErr
                                  (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,(xmlSchemaBasicItemPtr)pxVar17,
                                   (xmlAttrPtr)pxVar18,"default","fixed");
                        pxStackY_a0 = pxVar18;
                      }
                    }
                    pxVar17 = (xmlSchemaTypePtr)pxVar11->id;
                    if (pxVar17 != (xmlSchemaTypePtr)0x0) {
                      if (((pxVar17->node != (xmlNodePtr)0x0) &&
                          (iVar7 = xmlStrEqual(pxVar17->name,(xmlChar *)"annotation"), iVar7 != 0))
                         && (iVar7 = xmlStrEqual(pxVar17->node->name,
                                                 (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                            iVar7 != 0)) {
                        pxVar19 = (xmlSchemaAttributePtr_conflict)
                                  xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar17,1);
                        local_50->attributes = pxVar19;
                        pxVar17 = (xmlSchemaTypePtr)pxVar17->annot;
                        pxStackY_a0 = local_50;
                        if (pxVar17 == (xmlSchemaTypePtr)0x0) goto LAB_0018640b;
                      }
                      if (((pxVar17->node != (xmlNodePtr)0x0) &&
                          (iVar7 = xmlStrEqual(pxVar17->name,"simpleType"), iVar7 != 0)) &&
                         (iVar7 = xmlStrEqual(pxVar17->node->name,
                                              (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                         iVar7 != 0)) {
                        if (*ppxVar13 == (xmlSchemaAnnotPtr)0x0) {
                          pxVar18 = xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)pxVar17,0);
                          local_50->base = (xmlChar *)pxVar18;
                          pxStackY_a0 = local_50;
                        }
                        else {
                          in_R8 = 
                          "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                          ;
                          in_R9 = (char *)0x0;
                          pxStackY_a0 = pxVar17;
                          xmlSchemaPContentErr
                                    (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,
                                     (xmlSchemaBasicItemPtr)pxVar11,(xmlNodePtr)pxVar17,
                                     (xmlNodePtr)
                                     "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                                     ,(char *)0x0,in_stack_ffffffffffffff68);
                        }
                        pxVar17 = (xmlSchemaTypePtr)pxVar17->annot;
                        if (pxVar17 == (xmlSchemaTypePtr)0x0) goto LAB_0018640b;
                      }
                      in_R9 = "(annotation?, simpleType?)";
                      pxStackY_a0 = pxVar17;
                      goto LAB_00186403;
                    }
                  }
                }
                else {
                  pxStackY_a0 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                  in_stack_ffffffffffffff68 = "The value of the attribute must not match \'xmlns\'";
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)0x0;
                  xmlSchemaPSimpleTypeErr
                            (pctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar10,
                             (xmlNodePtr)pxStackY_a0,(xmlSchemaTypePtr)0x0,(char *)0x0,
                             (xmlChar *)"The value of the attribute must not match \'xmlns\'",
                             (char *)0x0,in_stack_ffffffffffffff78,
                             (xmlChar *)in_stack_ffffffffffffff80);
                }
              }
            }
          }
        }
LAB_0018640b:
        while (((pxVar11 = (xmlSchemaTypePtr)pxVar11->annot, pxVar11 != (xmlSchemaTypePtr)0x0 &&
                (pxVar11->node != (xmlNodePtr)0x0)) &&
               ((iVar7 = xmlStrEqual(pxVar11->name,(xmlChar *)"annotation"), iVar7 != 0 &&
                (iVar7 = xmlStrEqual(pxVar11->node->name,
                                     (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar7 != 0)))))
        {
          pxVar14 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar11,1);
          if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
            schema->annot = pxVar14;
          }
          else {
            xmlSchemaFreeAnnot(pxVar14);
          }
        }
      }
LAB_0018678f:
      pctxt->ctxtType = (xmlSchemaTypePtr)0x0;
      if ((local_54 != pctxt->nberrors) &&
         (local_70 = (xmlSchemaTypePtr)(ulong)(uint)pctxt->err, pctxt->err == 0)) {
        local_70 = (xmlSchemaTypePtr)(ulong)(uint)pctxt->err;
      }
    }
  }
LAB_001867d5:
  pctxt->constructor->bucket = pxVar4;
  schema->doc = local_38;
  schema->flags = uVar2;
  return (int)local_70;
}

Assistant:

static int
xmlSchemaParseNewDocWithContext(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    int oldFlags;
    xmlDocPtr oldDoc;
    xmlNodePtr node;
    int ret, oldErrs;
    xmlSchemaBucketPtr oldbucket = pctxt->constructor->bucket;

    /*
    * Save old values; reset the *main* schema.
    * URGENT TODO: This is not good; move the per-document information
    * to the parser. Get rid of passing the main schema to the
    * parsing functions.
    */
    oldFlags = schema->flags;
    oldDoc = schema->doc;
    if (schema->flags != 0)
	xmlSchemaClearSchemaDefaults(schema);
    schema->doc = bucket->doc;
    pctxt->schema = schema;
    /*
    * Keep the current target namespace on the parser *not* on the
    * main schema.
    */
    pctxt->targetNamespace = bucket->targetNamespace;
    WXS_CONSTRUCTOR(pctxt)->bucket = bucket;

    if ((bucket->targetNamespace != NULL) &&
	xmlStrEqual(bucket->targetNamespace, xmlSchemaNs)) {
	/*
	* We are parsing the schema for schemas!
	*/
	pctxt->isS4S = 1;
    }
    /* Mark it as parsed, even if parsing fails. */
    bucket->parsed++;
    /* Compile the schema doc. */
    node = xmlDocGetRootElement(bucket->doc);
    ret = xmlSchemaParseSchemaElement(pctxt, schema, node);
    if (ret != 0)
	goto exit;
    /* An empty schema; just get out. */
    if (node->children == NULL)
	goto exit;
    oldErrs = pctxt->nberrors;
    ret = xmlSchemaParseSchemaTopLevel(pctxt, schema, node->children);
    if (ret != 0)
	goto exit;
    /*
    * TODO: Not nice, but I'm not 100% sure we will get always an error
    * as a result of the above functions; so better rely on pctxt->err
    * as well.
    */
    if ((ret == 0) && (oldErrs != pctxt->nberrors)) {
	ret = pctxt->err;
	goto exit;
    }

exit:
    WXS_CONSTRUCTOR(pctxt)->bucket = oldbucket;
    /* Restore schema values. */
    schema->doc = oldDoc;
    schema->flags = oldFlags;
    return(ret);
}